

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

bool __thiscall miniscript::Node<unsigned_int>::CheckOpsLimit(Node<unsigned_int> *this)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  Node<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_int> ops;
  MiniscriptContext in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsTapscript(in_stack_ffffffffffffffc8);
  if (bVar2) {
    local_11 = true;
  }
  else {
    GetOps(in_RDI);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar2) {
      puVar3 = std::optional<unsigned_int>::operator*
                         ((optional<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_11 = *puVar3 < 0xca;
    }
    else {
      local_11 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckOpsLimit() const {
        if (IsTapscript(m_script_ctx)) return true;
        if (const auto ops = GetOps()) return *ops <= MAX_OPS_PER_SCRIPT;
        return true;
    }